

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> * __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::operator=
          (ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> *this,
          ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> *other)

{
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  pRVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (UnfinishedValue *)0x0;
  other->pos = (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)0x0;
  other->endPtr = (UnfinishedValue *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }